

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O3

void __thiscall
JsUtil::List<IR::Opnd_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
Reset(List<IR::Opnd_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      *this)

{
  BVSparseNode *buffer;
  Type this_00;
  
  buffer = (BVSparseNode *)
           (this->super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>).buffer
  ;
  if (buffer != (BVSparseNode *)0x0) {
    this_00 = (this->super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>).
              alloc;
    if ((long)this->length == 3) {
      buffer->next = this_00->bvFreeList;
      this_00->bvFreeList = buffer;
    }
    else {
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this_00,
                 buffer,(long)this->length << 3);
    }
    (this->super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>).buffer =
         (Type)0x0;
    (this->super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>).count = 0;
    this->length = 0;
  }
  return;
}

Assistant:

void Reset()
        {
            if (this->buffer != nullptr)
            {
                auto freeFunc = AllocatorInfo::GetFreeFunc();
                AllocatorFree(this->alloc, freeFunc, this->buffer, sizeof(T) * length); // TODO: Better version of DeleteArray?

                this->buffer = nullptr;
                this->count = 0;
                length = 0;
            }
        }